

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

void mbedtls_ecp_keypair_init(mbedtls_ecp_keypair *key)

{
  mbedtls_ecp_group_init(&key->grp);
  mbedtls_mpi_init(&key->d);
  mbedtls_ecp_point_init(&key->Q);
  return;
}

Assistant:

void mbedtls_ecp_keypair_init( mbedtls_ecp_keypair *key )
{
    ECP_VALIDATE( key != NULL );

    mbedtls_ecp_group_init( &key->grp );
    mbedtls_mpi_init( &key->d );
    mbedtls_ecp_point_init( &key->Q );
}